

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bitmap.cpp
# Opt level: O0

int ON_WindowsBitmapHelper_PaletteColorCount(int bmiHeader_biClrUsed,int bmiHeader_biBitCount)

{
  undefined4 local_14;
  int color_count;
  int bmiHeader_biBitCount_local;
  int bmiHeader_biClrUsed_local;
  
  local_14 = bmiHeader_biClrUsed;
  if (bmiHeader_biClrUsed == 0) {
    if (bmiHeader_biBitCount == 1) {
      local_14 = 2;
    }
    else if (bmiHeader_biBitCount == 4) {
      local_14 = 0x10;
    }
    else if (bmiHeader_biBitCount == 8) {
      local_14 = 0x100;
    }
    else {
      local_14 = 0;
    }
  }
  return local_14;
}

Assistant:

static
int ON_WindowsBitmapHelper_PaletteColorCount( int bmiHeader_biClrUsed, int bmiHeader_biBitCount )
{
  int color_count = 0;
  
  if ( bmiHeader_biClrUsed )
  {
    color_count = bmiHeader_biClrUsed;
  }
  else 
  {  
    switch( bmiHeader_biBitCount )
    {
    case 1:
      color_count = 2;
      break;
    case 4:
      color_count = 16;
      break;
    case 8:
      color_count = 256;
      break;
    default:
      color_count = 0;
    }
  }  
  return color_count;
}